

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSceneCombiner.cpp
# Opt level: O2

void __thiscall
utSceneCombiner_CopySceneWithNullptr_AI_NO_EXCEPTion_Test::TestBody
          (utSceneCombiner_CopySceneWithNullptr_AI_NO_EXCEPTion_Test *this)

{
  bool bVar1;
  AssertHelper AStack_18;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      Assimp::SceneCombiner::CopyScene((aiScene **)0x0,(aiScene *)0x0,true);
    }
  }
  else {
    testing::Message::Message((Message *)&local_10);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSceneCombiner.cpp"
               ,0x4d,
               "Expected: SceneCombiner::CopyScene( nullptr, nullptr ) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&AStack_18,(Message *)&local_10);
    testing::internal::AssertHelper::~AssertHelper(&AStack_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_10);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      Assimp::SceneCombiner::CopySceneFlat((aiScene **)0x0,(aiScene *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_10);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSceneCombiner.cpp"
               ,0x4e,
               "Expected: SceneCombiner::CopySceneFlat( nullptr, nullptr ) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&AStack_18,(Message *)&local_10);
    testing::internal::AssertHelper::~AssertHelper(&AStack_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_10);
  }
  return;
}

Assistant:

TEST_F( utSceneCombiner, CopySceneWithNullptr_AI_NO_EXCEPTion ) {
    EXPECT_NO_THROW( SceneCombiner::CopyScene( nullptr, nullptr ) );
    EXPECT_NO_THROW( SceneCombiner::CopySceneFlat( nullptr, nullptr ) );
}